

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_table_calculation.cpp
# Opt level: O2

void __thiscall
ParseTableCalculation::ParseTableCalculation
          (ParseTableCalculation *this,
          vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *rules,bool print_debug)

{
  pointer pvVar1;
  long lVar2;
  uint __line;
  bool bVar3;
  undefined8 in_RAX;
  mapped_type *this_00;
  int iVar4;
  char *__assertion;
  undefined8 uStack_38;
  
  this->print_debug_ = print_debug;
  uStack_38 = in_RAX;
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::vector(&this->rules_,rules);
  (this->non_terminal_to_rule_indices_)._M_h._M_buckets =
       &(this->non_terminal_to_rule_indices_)._M_h._M_single_bucket;
  (this->non_terminal_to_rule_indices_)._M_h._M_bucket_count = 1;
  (this->non_terminal_to_rule_indices_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->non_terminal_to_rule_indices_)._M_h._M_element_count = 0;
  (this->non_terminal_to_rule_indices_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->non_terminal_to_rule_indices_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->non_terminal_to_rule_indices_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->non_terminal_first_sets_)._M_h._M_buckets =
       &(this->non_terminal_first_sets_)._M_h._M_single_bucket;
  (this->non_terminal_first_sets_)._M_h._M_bucket_count = 1;
  (this->non_terminal_first_sets_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->non_terminal_first_sets_)._M_h._M_element_count = 0;
  (this->non_terminal_first_sets_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->non_terminal_first_sets_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->non_terminal_first_sets_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pvVar1 = (this->rules_).
           super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar2 = *(long *)&(pvVar1->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data;
  if ((long)*(pointer *)
             ((long)&(pvVar1->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data + 8) - lVar2 == 0x60) {
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar2 + 0x40),"EOF");
    if (bVar3) {
      iVar4 = 0;
      while( true ) {
        uStack_38 = CONCAT44(iVar4,(undefined4)uStack_38);
        pvVar1 = (this->rules_).
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((int)(((long)(this->rules_).
                         super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18) <= iVar4
           ) break;
        this_00 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->non_terminal_to_rule_indices_,
                               pvVar1[iVar4].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start);
        std::vector<int,_std::allocator<int>_>::push_back
                  (this_00,(value_type_conflict3 *)((long)&uStack_38 + 4));
        iVar4 = uStack_38._4_4_ + 1;
      }
      return;
    }
    __assertion = "rules_.front()[2] == \"EOF\"";
    __line = 0xc;
  }
  else {
    __assertion = "rules_.front().size() == 3";
    __line = 0xb;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/matej-svejda[P]script2000/src/parse_table_calculation.cpp"
                ,__line,
                "ParseTableCalculation::ParseTableCalculation(const std::vector<std::vector<std::string>> &, bool)"
               );
}

Assistant:

ParseTableCalculation::ParseTableCalculation(const std::vector<std::vector<std::string>>& rules, bool print_debug)
	: print_debug_(print_debug),
	  rules_(rules)
{
	assert(rules_.front().size() == 3);
	assert(rules_.front()[2] == "EOF");

	for (int i = 0; i < static_cast<int>(rules_.size()); ++i)
	{
		non_terminal_to_rule_indices_[rules_[i].front()].push_back(i);
	}
}